

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O0

DdNode * Llb_BddQuantifyPis(Aig_Man_t *pInit,DdManager *dd,DdNode *bFunc)

{
  abctime aVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  abctime TimeStop;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bVar;
  DdNode *bFunc_local;
  DdManager *dd_local;
  Aig_Man_t *pInit_local;
  
  iVar2 = Cudd_ReadSize(dd);
  iVar3 = Aig_ManCiNum(pInit);
  if (iVar2 != iVar3) {
    __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Bad.c"
                  ,0x73,"DdNode *Llb_BddQuantifyPis(Aig_Man_t *, DdManager *, DdNode *)");
  }
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bTemp = Cudd_ReadOne(dd);
  Cudd_Ref(bTemp);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManPiNum(pInit), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    Vec_PtrEntry(pInit->vCis,TimeStop._4_4_);
    iVar2 = Aig_ManRegNum(pInit);
    pDVar4 = Cudd_bddIthVar(dd,iVar2 + TimeStop._4_4_);
    pDVar4 = Cudd_bddAnd(dd,bTemp,pDVar4);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,bTemp);
    bTemp = pDVar4;
  }
  pDVar4 = Cudd_bddExistAbstract(dd,bFunc,bTemp);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,bTemp);
  Cudd_Deref(pDVar4);
  dd->TimeStop = aVar1;
  return pDVar4;
}

Assistant:

DdNode * Llb_BddQuantifyPis( Aig_Man_t * pInit, DdManager * dd, DdNode * bFunc )
{
    DdNode * bVar, * bCube, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    // create PI cube
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachPi( pInit, pObj, i )    {
        bVar  = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // quantify PI cube
    bFunc = Cudd_bddExistAbstract( dd, bFunc, bCube );  Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_Deref( bFunc );
    dd->TimeStop = TimeStop;
    return bFunc;
}